

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint32 drwav_get_bytes_per_pcm_frame(drwav *pWav)

{
  if ((pWav->bitsPerSample & 7) != 0) {
    return (drwav_uint32)(pWav->fmt).blockAlign;
  }
  return (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
}

Assistant:

static drwav_uint32 drwav_get_bytes_per_pcm_frame(drwav* pWav)
{
    /*
    The bytes per frame is a bit ambiguous. It can be either be based on the bits per sample, or the block align. The way I'm doing it here
    is that if the bits per sample is a multiple of 8, use floor(bitsPerSample*channels/8), otherwise fall back to the block align.
    */
    if ((pWav->bitsPerSample & 0x7) == 0) {
        /* Bits per sample is a multiple of 8. */
        return (pWav->bitsPerSample * pWav->fmt.channels) >> 3;
    } else {
        return pWav->fmt.blockAlign;
    }
}